

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,string *condition,string *orderBy)

{
  bool bVar1;
  long lVar2;
  sqlid_t local_218;
  undefined1 local_209;
  string local_208 [32];
  shared_res<hiberlite::autoclosed_con> local_1e8;
  undefined1 local_1d8 [8];
  SQLiteSelect sel;
  string local_1a0 [32];
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [8];
  string query;
  string local_c0 [32];
  string local_a0 [8];
  string order;
  string local_70 [32];
  string local_50 [8];
  string where;
  string *orderBy_local;
  string *condition_local;
  string *table_local;
  shared_connection *con_local;
  vector<long_long,_std::allocator<long_long>_> *ans;
  
  std::__cxx11::string::string(local_50);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::operator+((char *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" WHERE ");
    std::__cxx11::string::operator=(local_50,local_70);
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::string(local_a0);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::operator+((char *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" ORDER BY "
                  );
    std::__cxx11::string::operator=(local_a0,local_c0);
    std::__cxx11::string::~string(local_c0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"hiberlite_id",(allocator *)((long)&sel.con.res + 7));
  std::operator+((char *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"SELECT ");
  std::operator+(local_160,(char *)local_180);
  std::operator+(local_140,local_160);
  std::operator+(local_120,local_140);
  std::operator+(local_100,local_120);
  std::operator+(local_e0,(char *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sel.con.res + 7));
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_1e8,con);
  std::__cxx11::string::string(local_208,(string *)local_e0);
  SQLiteSelect::SQLiteSelect((SQLiteSelect *)local_1d8,&local_1e8,(string *)local_208);
  std::__cxx11::string::~string(local_208);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1e8);
  local_209 = 0;
  std::vector<long_long,_std::allocator<long_long>_>::vector(__return_storage_ptr__);
  while (bVar1 = SQLiteSelect::step((SQLiteSelect *)local_1d8), bVar1) {
    local_218 = SQLiteSelect::get_int64((SQLiteSelect *)local_1d8,0);
    std::vector<long_long,_std::allocator<long_long>_>::push_back(__return_storage_ptr__,&local_218)
    ;
  }
  local_209 = 1;
  SQLiteSelect::~SQLiteSelect((SQLiteSelect *)local_1d8);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectIds(shared_connection con, const std::string table, const std::string condition, const std::string orderBy)
{
	std::string where;
	if(condition.size())
		where=" WHERE "+condition;
	std::string order;
	if(orderBy.size())
		order=" ORDER BY "+orderBy;
	std::string query="SELECT "+std::string(HIBERLITE_PRIMARY_KEY_COLUMN)
			+" FROM "+table
			+where
			+order
			+";";
	SQLiteSelect sel(con, query);
	std::vector<sqlid_t> ans;
	while(sel.step())
		ans.push_back( sel.get_int64(0) );
	return ans;
}